

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

void Json::appendHex(String *result,uint ch)

{
  undefined1 uVar1;
  char *pcVar2;
  ulong uVar3;
  String result_1;
  long *local_40 [2];
  long local_30 [2];
  
  pcVar2 = (char *)std::__cxx11::string::append((char *)result);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct((ulong)local_40,'\x04');
  uVar3 = (ulong)(ch >> 8 & 0xff);
  uVar1 = hex2[uVar3 * 2 + 1];
  *(undefined1 *)local_40[0] = hex2[uVar3 * 2];
  *(undefined1 *)((long)local_40[0] + 1) = uVar1;
  uVar1 = hex2[(ulong)(ch & 0xff) * 2 + 1];
  *(undefined1 *)((long)local_40[0] + 2) = hex2[(ulong)(ch & 0xff) * 2];
  *(undefined1 *)((long)local_40[0] + 3) = uVar1;
  std::__cxx11::string::_M_append(pcVar2,(ulong)local_40[0]);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

static void appendHex(String& result, unsigned ch) {
  result.append("\\u").append(toHex16Bit(ch));
}